

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O0

void __thiscall avro::json::JsonGenerator::encodeNumber<int>(JsonGenerator *this,int t)

{
  int in_ESI;
  JsonGenerator *in_RDI;
  string *s;
  ostringstream oss;
  ostringstream *this_00;
  StreamWriter *in_stack_fffffffffffffe40;
  ostringstream local_188 [380];
  int local_c;
  
  local_c = in_ESI;
  sep(in_RDI);
  this_00 = local_188;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::ostream::operator<<(this_00,local_c);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator[]((ulong)&stack0xfffffffffffffe40);
  std::__cxx11::string::size();
  StreamWriter::writeBytes(in_stack_fffffffffffffe40,(uint8_t *)this_00,(size_t)in_RDI);
  sep2(in_RDI);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void encodeNumber(T t) {
        sep();
        std::ostringstream oss;
        oss << t;
        const std::string& s = oss.str();
        out_.writeBytes(reinterpret_cast<const uint8_t*>(&s[0]), s.size());
        sep2();
    }